

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiclass.cc
# Opt level: O2

void MULTICLASS::print_label_pred(vw *all,example *ec,uint32_t prediction)

{
  bool holdout_set_off;
  char *pcVar1;
  substring sVar2;
  substring sVar3;
  allocator local_8a;
  allocator local_89;
  char *local_88;
  shared_data *local_80;
  uint64_t local_78;
  string local_70;
  string local_50;
  
  sVar2 = namedlabels::get(all->sd->ldict,(ec->l).multi.label);
  pcVar1 = sVar2.begin;
  sVar3 = namedlabels::get(all->sd->ldict,prediction);
  local_80 = all->sd;
  local_78 = all->current_pass;
  holdout_set_off = all->holdout_set_off;
  local_88 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_50,"unknown",&local_89);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar1,sVar2.end);
  }
  if (sVar3.begin == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_70,"unknown",&local_8a);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,sVar3.begin,sVar3.end);
  }
  shared_data::print_update
            (local_80,holdout_set_off,local_78,&local_50,&local_70,ec->num_features,
             all->progress_add,all->progress_arg);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void print_label_pred(vw& all, example& ec, uint32_t prediction)
{
  substring ss_label = all.sd->ldict->get(ec.l.multi.label);
  substring ss_pred = all.sd->ldict->get(prediction);
  all.sd->print_update(all.holdout_set_off, all.current_pass,
      !ss_label.begin ? "unknown" : string(ss_label.begin, ss_label.end - ss_label.begin),
      !ss_pred.begin ? "unknown" : string(ss_pred.begin, ss_pred.end - ss_pred.begin), ec.num_features,
      all.progress_add, all.progress_arg);
}